

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
insert_simplex_raw<std::vector<int,std::allocator<int>>>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          vector<int,_std::allocator<int>_> *simplex,Filtration_value *filtration)

{
  uint uVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer *ppiVar4;
  ulong uVar5;
  uint *puVar6;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>,_bool>
  pVar7;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_bool>
  pVar8;
  __buckets_ptr local_40;
  char local_38;
  
  ppiVar4 = &simplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar6 = (uint *)*filtration;
  while( true ) {
    uVar3 = *puVar6;
    uVar1 = *(uint *)&simplex[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
    if (puVar6 == (uint *)((long)filtration[1] + -4)) break;
    if (uVar3 == uVar1) goto LAB_0010eb60;
    insert_node_<false,true,false,double_const&>
              ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0,
               (Siblings *)simplex,(Vertex_handle)ppiVar4,(double *)(ulong)uVar3);
    ppiVar4 = (pointer *)local_40[3];
    puVar6 = puVar6 + 1;
  }
  if (uVar3 != uVar1) {
    pVar7 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)&stack0xffffffffffffffc0
                       ,(Siblings *)simplex,(Vertex_handle)ppiVar4,(double *)(ulong)uVar3);
    uVar5 = pVar7._8_8_;
    if (local_38 == '\x01') {
      uVar3 = (int)((ulong)((long)filtration[1] - (long)*filtration) >> 2) - 1;
      uVar5 = (ulong)uVar3;
      if (*(int *)&simplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish < (int)uVar3) {
        *(uint *)&simplex[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = uVar3;
      }
    }
    (this->nodes_label_to_list_)._M_h._M_buckets = local_40;
    *(char *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_38;
    pVar8._8_8_ = uVar5;
    pVar8.first.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
    return pVar8;
  }
LAB_0010eb60:
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "cannot use the dummy null_vertex() as a real vertex";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_raw(const RandomVertexHandleRange& simplex,
                                                     const Filtration_value& filtration) {
    Siblings * curr_sib = &root_;
    std::pair<Dictionary_it, bool> res_insert;
    auto vi = simplex.begin();

    for (; vi != std::prev(simplex.end()); ++vi) {
      GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
      res_insert = insert_node_<false, true, false>(curr_sib, *vi, filtration);
      curr_sib = res_insert.first->second.children();
    }

    GUDHI_CHECK(*vi != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    res_insert = insert_node_<true, false, true>(curr_sib, *vi, filtration);
    if (res_insert.second){
      int dim = static_cast<int>(boost::size(simplex)) - 1;
      if (dim > dimension_) {
        // Update dimension if needed
        dimension_ = dim;
      }
    }
    return res_insert;
  }